

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

void HistogramAdd(VP8LHistogram *h1,VP8LHistogram *h2,VP8LHistogram *hout)

{
  uint16_t uVar1;
  uint32_t *puVar2;
  HistogramIndex index;
  long lVar3;
  bool bVar4;
  int length;
  uint32_t *p1;
  uint32_t *p2;
  uint32_t *pout_const;
  int local_4c;
  uint32_t *local_48;
  uint32_t *local_40;
  uint32_t *local_38;
  
  lVar3 = 0;
  do {
    if (lVar3 == 5) {
      for (lVar3 = 0; lVar3 != 5; lVar3 = lVar3 + 1) {
        uVar1 = h1->trivial_symbol[lVar3];
        if (uVar1 != h2->trivial_symbol[lVar3]) {
          uVar1 = 0xffff;
        }
        hout->trivial_symbol[lVar3] = uVar1;
        bVar4 = true;
        if (h1->is_used[lVar3] == '\0') {
          bVar4 = h2->is_used[lVar3] != '\0';
        }
        hout->is_used[lVar3] = bVar4;
      }
      return;
    }
    index = (HistogramIndex)lVar3;
    GetPopulationInfo(h1,index,&local_48,&local_4c);
    GetPopulationInfo(h2,index,&local_40,&local_4c);
    GetPopulationInfo(hout,index,&local_38,&local_4c);
    puVar2 = local_48;
    if (h2 == hout) {
      if (h1->is_used[lVar3] != '\0') {
        if (hout->is_used[lVar3] == '\0') goto LAB_0013b04c;
        (*VP8LAddVectorEq)(local_48,local_38,local_4c);
      }
    }
    else if (h1->is_used[lVar3] == '\0') {
      puVar2 = local_40;
      if (h2->is_used[lVar3] != '\0') goto LAB_0013b04c;
      memset(local_38,0,(long)local_4c << 2);
    }
    else if (h2->is_used[lVar3] == '\0') {
LAB_0013b04c:
      memcpy(local_38,puVar2,(long)local_4c << 2);
    }
    else {
      (*VP8LAddVector)(local_48,local_40,local_38,local_4c);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static WEBP_INLINE void HistogramAdd(const VP8LHistogram* const h1,
                                     const VP8LHistogram* const h2,
                                     VP8LHistogram* const hout) {
  int i;
  assert(h1->palette_code_bits == h2->palette_code_bits);

  for (i = 0; i < 5; ++i) {
    int length;
    const uint32_t *p1, *p2, *pout_const;
    uint32_t* pout;
    GetPopulationInfo(h1, (HistogramIndex)i, &p1, &length);
    GetPopulationInfo(h2, (HistogramIndex)i, &p2, &length);
    GetPopulationInfo(hout, (HistogramIndex)i, &pout_const, &length);
    pout = (uint32_t*)pout_const;
    if (h2 == hout) {
      if (h1->is_used[i]) {
        if (hout->is_used[i]) {
          VP8LAddVectorEq(p1, pout, length);
        } else {
          memcpy(pout, p1, length * sizeof(pout[0]));
        }
      }
    } else {
      if (h1->is_used[i]) {
        if (h2->is_used[i]) {
          VP8LAddVector(p1, p2, pout, length);
        } else {
          memcpy(pout, p1, length * sizeof(pout[0]));
        }
      } else if (h2->is_used[i]) {
        memcpy(pout, p2, length * sizeof(pout[0]));
      } else {
        memset(pout, 0, length * sizeof(pout[0]));
      }
    }
  }

  for (i = 0; i < 5; ++i) {
    hout->trivial_symbol[i] = h1->trivial_symbol[i] == h2->trivial_symbol[i]
                                  ? h1->trivial_symbol[i]
                                  : VP8L_NON_TRIVIAL_SYM;
    hout->is_used[i] = h1->is_used[i] || h2->is_used[i];
  }
}